

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_signature_serialize_der
              (secp256k1_context *ctx,uchar *output,size_t *outputlen,secp256k1_ecdsa_signature *sig
              )

{
  ulong uVar1;
  char *__src;
  char *__src_00;
  ulong uVar2;
  size_t __n;
  size_t __n_00;
  secp256k1_scalar s;
  secp256k1_scalar r;
  uchar r_1 [33];
  uint local_90;
  uint local_8c;
  char local_88 [29];
  undefined4 uStack_6b;
  char local_58 [29];
  undefined4 uStack_3b;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_signature_serialize_der_cold_4();
  }
  else if (output != (uchar *)0x0) {
    if (outputlen == (size_t *)0x0) {
      secp256k1_ecdsa_signature_serialize_der_cold_2();
      return 0;
    }
    if (sig == (secp256k1_ecdsa_signature *)0x0) {
      secp256k1_ecdsa_signature_serialize_der_cold_1();
      return 0;
    }
    secp256k1_scalar_set_b32(&local_8c,sig->data,(int *)0x0);
    secp256k1_scalar_set_b32(&local_90,sig->data + 0x20,(int *)0x0);
    local_58[0x10] = 0;
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[0x18] = 0;
    local_58[0x19] = '\0';
    local_58[0x1a] = '\0';
    local_58[0x1b] = '\0';
    local_58[0x1c] = '\0';
    uStack_3b = 0;
    local_58[0] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = 0;
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_88[0x10] = 0;
    local_88[0x11] = '\0';
    local_88[0x12] = '\0';
    local_88[0x13] = '\0';
    local_88[0x14] = '\0';
    local_88[0x15] = '\0';
    local_88[0x16] = '\0';
    local_88[0x17] = '\0';
    local_88[0x18] = 0;
    local_88[0x19] = '\0';
    local_88[0x1a] = '\0';
    local_88[0x1b] = '\0';
    local_88[0x1c] = '\0';
    uStack_6b = 0;
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = 0;
    local_88[9] = '\0';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    secp256k1_scalar_verify(&local_8c);
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[0x18] = 0;
    local_58[0x19] = '\0';
    local_58[0x1a] = '\0';
    local_58[0x1b] = '\0';
    local_58[0x1c] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = 0;
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = 0;
    uStack_3b = local_8c >> 0x18 | (local_8c & 0xff0000) >> 8 | (local_8c & 0xff00) << 8 |
                local_8c << 0x18;
    secp256k1_scalar_verify(&local_90);
    local_88[0x11] = '\0';
    local_88[0x12] = '\0';
    local_88[0x13] = '\0';
    local_88[0x14] = '\0';
    local_88[0x15] = '\0';
    local_88[0x16] = '\0';
    local_88[0x17] = '\0';
    local_88[0x18] = 0;
    local_88[0x19] = '\0';
    local_88[0x1a] = '\0';
    local_88[0x1b] = '\0';
    local_88[0x1c] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = 0;
    local_88[9] = '\0';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    local_88[0x10] = 0;
    uStack_6b = local_90 >> 0x18 | (local_90 & 0xff0000) >> 8 | (local_90 & 0xff00) << 8 |
                local_90 << 0x18;
    __n_00 = 0x21;
    __src = local_58;
    do {
      if ((*__src != '\0') || (__src[1] < '\0')) goto LAB_00107e7f;
      __n_00 = __n_00 - 1;
      __src = __src + 1;
    } while (__n_00 != 1);
    __n_00 = 1;
    __src = (char *)((long)&uStack_3b + 3);
LAB_00107e7f:
    __n = 0x21;
    __src_00 = local_88;
    do {
      if ((*__src_00 != '\0') || (__src_00[1] < '\0')) goto LAB_00107eaa;
      __n = __n - 1;
      __src_00 = __src_00 + 1;
    } while (__n != 1);
    __n = 1;
    __src_00 = (char *)((long)&uStack_6b + 3);
LAB_00107eaa:
    uVar2 = __n + 6 + __n_00;
    uVar1 = *outputlen;
    *outputlen = uVar2;
    if (uVar2 <= uVar1) {
      *output = '0';
      output[1] = (uchar)__n + (uchar)__n_00 + '\x04';
      output[2] = '\x02';
      output[3] = (uchar)__n_00;
      memcpy(output + 4,__src,__n_00);
      output[__n_00 + 4] = '\x02';
      output[__n_00 + 5] = (uchar)__n;
      memcpy(output + __n_00 + 6,__src_00,__n);
      return 1;
    }
    return 0;
  }
  secp256k1_ecdsa_signature_serialize_der_cold_3();
  return 0;
}

Assistant:

int secp256k1_ecdsa_signature_serialize_der(const secp256k1_context* ctx, unsigned char *output, size_t *outputlen, const secp256k1_ecdsa_signature* sig) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(outputlen != NULL);
    ARG_CHECK(sig != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return secp256k1_ecdsa_sig_serialize(output, outputlen, &r, &s);
}